

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_te2_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  long local_6c8;
  REF_INT local_6b8;
  long local_6b0;
  long local_690;
  long local_660;
  REF_INT local_650;
  long local_648;
  long local_628;
  long local_5f8;
  REF_INT local_5e8;
  long local_5e0;
  long local_5c0;
  long local_590;
  REF_INT local_580;
  long local_578;
  long local_558;
  long local_528;
  REF_INT local_518;
  long local_510;
  long local_4f0;
  long local_4c0;
  REF_INT local_4b0;
  long local_4a8;
  long local_488;
  long local_458;
  REF_INT local_448;
  long local_440;
  long local_420;
  long local_3f0;
  REF_INT local_3e0;
  long local_3d8;
  long local_3b8;
  long local_388;
  REF_INT local_378;
  long local_370;
  long local_350;
  long local_320;
  REF_INT local_310;
  long local_308;
  long local_2e8;
  int local_2c8;
  int local_29c;
  int local_270;
  int local_244;
  int local_218;
  int local_1ec;
  int local_1c0;
  int local_194;
  int local_168;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell;
  REF_INT nnodesg;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_private_macro_code_rss = 10;
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0xe2,
           "ref_fixture_te2_grid",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  local[0x1a] = 0;
  if (0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
    local_168 = 0 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_168 = -((ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                 ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  if (ref_mpi->id != local_168) {
    if (1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
        ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
    {
      local_194 = 1 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_194 = (1 - (ref_private_macro_code_rss -
                       ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                       ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                  (ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
    }
    if (ref_mpi->id != local_194) {
      if (3 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
          ref_private_macro_code_rss - ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)
         ) {
        local_1c0 = 3 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
      }
      else {
        local_1c0 = (3 - (ref_private_macro_code_rss -
                         ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                         ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                    ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                    (ref_private_macro_code_rss -
                    ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
      }
      if (ref_mpi->id != local_1c0) {
        if (4 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
            ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
          local_1ec = 4 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
        }
        else {
          local_1ec = (4 - (ref_private_macro_code_rss -
                           ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                           ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                      ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
        }
        if (ref_mpi->id != local_1ec) {
          if (5 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
              ref_private_macro_code_rss -
              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
            local_218 = 5 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
          }
          else {
            local_218 = (5 - (ref_private_macro_code_rss -
                             ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                             ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                        ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                        (ref_private_macro_code_rss -
                        ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
          }
          if (ref_mpi->id != local_218) {
            if (6 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
                ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
              local_244 = 6 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
            }
            else {
              local_244 = (6 - (ref_private_macro_code_rss -
                               ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                               ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                          ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                          (ref_private_macro_code_rss -
                          ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
            }
            if (ref_mpi->id != local_244) {
              if (7 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
                  ref_private_macro_code_rss -
                  ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
                local_270 = 7 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
              }
              else {
                local_270 = (7 - (ref_private_macro_code_rss -
                                 ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                                 ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                            ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                            (ref_private_macro_code_rss -
                            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
              }
              if (ref_mpi->id != local_270) {
                if (8 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
                    ref_private_macro_code_rss -
                    ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
                  local_29c = 8 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
                }
                else {
                  local_29c = (8 - (ref_private_macro_code_rss -
                                   ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                                   ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                              ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                              (ref_private_macro_code_rss -
                              ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
                }
                if (ref_mpi->id != local_29c) {
                  if (9 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
                      ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) {
                    local_2c8 = 9 / ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n);
                  }
                  else {
                    local_2c8 = (9 - (ref_private_macro_code_rss -
                                     ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))
                                     * ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)
                                ) / ((ref_private_macro_code_rss + -1) / ref_mpi->n) +
                                (ref_private_macro_code_rss -
                                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
                  }
                  if (ref_mpi->id != local_2c8) goto LAB_00151cae;
                }
              }
            }
          }
        }
      }
    }
  }
  uVar2 = ref_node_add(ref_node_00,0,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x103
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[cell * 0xf] = 0.0;
  ref_node_00->real[cell * 0xf + 1] = 0.0;
  ref_node_00->real[cell * 0xf + 2] = 0.0;
  if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
    local_2e8 = -1;
  }
  else {
    local_2e8 = ref_node_00->global[cell];
  }
  if (local_2e8 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_308 = -1;
    }
    else {
      local_308 = ref_node_00->global[cell];
    }
    local_310 = (REF_INT)(local_308 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_320 = -1;
    }
    else {
      local_320 = ref_node_00->global[cell];
    }
    local_310 = (int)((local_320 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[cell] = local_310;
  uVar2 = ref_node_add(ref_node_00,1,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x104
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[nnodesg * 0xf] = 1.0;
  ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
  ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
  if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
    local_350 = -1;
  }
  else {
    local_350 = ref_node_00->global[nnodesg];
  }
  if (local_350 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_370 = -1;
    }
    else {
      local_370 = ref_node_00->global[nnodesg];
    }
    local_378 = (REF_INT)(local_370 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_388 = -1;
    }
    else {
      local_388 = ref_node_00->global[nnodesg];
    }
    local_378 = (int)((local_388 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[nnodesg] = local_378;
  uVar2 = ref_node_add(ref_node_00,2,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x105
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[0] * 0xf] = 0.0;
  ref_node_00->real[local[0] * 0xf + 1] = 1.0;
  ref_node_00->real[local[0] * 0xf + 2] = 0.0;
  if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
    local_3b8 = -1;
  }
  else {
    local_3b8 = ref_node_00->global[local[0]];
  }
  if (local_3b8 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_3d8 = -1;
    }
    else {
      local_3d8 = ref_node_00->global[local[0]];
    }
    local_3e0 = (REF_INT)(local_3d8 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_3f0 = -1;
    }
    else {
      local_3f0 = ref_node_00->global[local[0]];
    }
    local_3e0 = (int)((local_3f0 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[0]] = local_3e0;
  uVar2 = ref_node_add(ref_node_00,3,local + 1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x106
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[1] * 0xf] = 0.0;
  ref_node_00->real[local[1] * 0xf + 1] = 0.0;
  ref_node_00->real[local[1] * 0xf + 2] = 1.0;
  if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
    local_420 = -1;
  }
  else {
    local_420 = ref_node_00->global[local[1]];
  }
  if (local_420 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_440 = -1;
    }
    else {
      local_440 = ref_node_00->global[local[1]];
    }
    local_448 = (REF_INT)(local_440 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_458 = -1;
    }
    else {
      local_458 = ref_node_00->global[local[1]];
    }
    local_448 = (int)((local_458 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[1]] = local_448;
  uVar2 = ref_node_add(ref_node_00,4,local + 2);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x107
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[2] * 0xf] = 0.5;
  ref_node_00->real[local[2] * 0xf + 1] = 0.0;
  ref_node_00->real[local[2] * 0xf + 2] = 0.0;
  if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
    local_488 = -1;
  }
  else {
    local_488 = ref_node_00->global[local[2]];
  }
  if (local_488 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
      local_4a8 = -1;
    }
    else {
      local_4a8 = ref_node_00->global[local[2]];
    }
    local_4b0 = (REF_INT)(local_4a8 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
      local_4c0 = -1;
    }
    else {
      local_4c0 = ref_node_00->global[local[2]];
    }
    local_4b0 = (int)((local_4c0 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[2]] = local_4b0;
  uVar2 = ref_node_add(ref_node_00,5,local + 3);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x108
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[3] * 0xf] = 0.5;
  ref_node_00->real[local[3] * 0xf + 1] = 0.5;
  ref_node_00->real[local[3] * 0xf + 2] = 0.0;
  if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
    local_4f0 = -1;
  }
  else {
    local_4f0 = ref_node_00->global[local[3]];
  }
  if (local_4f0 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
      local_510 = -1;
    }
    else {
      local_510 = ref_node_00->global[local[3]];
    }
    local_518 = (REF_INT)(local_510 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
      local_528 = -1;
    }
    else {
      local_528 = ref_node_00->global[local[3]];
    }
    local_518 = (int)((local_528 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[3]] = local_518;
  uVar2 = ref_node_add(ref_node_00,6,local + 4);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x109
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[4] * 0xf] = 0.0;
  ref_node_00->real[local[4] * 0xf + 1] = 0.5;
  ref_node_00->real[local[4] * 0xf + 2] = 0.0;
  if (((local[4] < 0) || (ref_node_00->max <= local[4])) || (ref_node_00->global[local[4]] < 0)) {
    local_558 = -1;
  }
  else {
    local_558 = ref_node_00->global[local[4]];
  }
  if (local_558 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[4] < 0) || (ref_node_00->max <= local[4])) || (ref_node_00->global[local[4]] < 0)) {
      local_578 = -1;
    }
    else {
      local_578 = ref_node_00->global[local[4]];
    }
    local_580 = (REF_INT)(local_578 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[4] < 0) || (ref_node_00->max <= local[4])) || (ref_node_00->global[local[4]] < 0)) {
      local_590 = -1;
    }
    else {
      local_590 = ref_node_00->global[local[4]];
    }
    local_580 = (int)((local_590 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[4]] = local_580;
  uVar2 = ref_node_add(ref_node_00,7,local + 5);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x10a
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[5] * 0xf] = 0.0;
  ref_node_00->real[local[5] * 0xf + 1] = 0.0;
  ref_node_00->real[local[5] * 0xf + 2] = 0.5;
  if (((local[5] < 0) || (ref_node_00->max <= local[5])) || (ref_node_00->global[local[5]] < 0)) {
    local_5c0 = -1;
  }
  else {
    local_5c0 = ref_node_00->global[local[5]];
  }
  if (local_5c0 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[5] < 0) || (ref_node_00->max <= local[5])) || (ref_node_00->global[local[5]] < 0)) {
      local_5e0 = -1;
    }
    else {
      local_5e0 = ref_node_00->global[local[5]];
    }
    local_5e8 = (REF_INT)(local_5e0 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[5] < 0) || (ref_node_00->max <= local[5])) || (ref_node_00->global[local[5]] < 0)) {
      local_5f8 = -1;
    }
    else {
      local_5f8 = ref_node_00->global[local[5]];
    }
    local_5e8 = (int)((local_5f8 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[5]] = local_5e8;
  uVar2 = ref_node_add(ref_node_00,8,local + 6);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x10b
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[6] * 0xf] = 0.5;
  ref_node_00->real[local[6] * 0xf + 1] = 0.0;
  ref_node_00->real[local[6] * 0xf + 2] = 0.5;
  if (((local[6] < 0) || (ref_node_00->max <= local[6])) || (ref_node_00->global[local[6]] < 0)) {
    local_628 = -1;
  }
  else {
    local_628 = ref_node_00->global[local[6]];
  }
  if (local_628 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[6] < 0) || (ref_node_00->max <= local[6])) || (ref_node_00->global[local[6]] < 0)) {
      local_648 = -1;
    }
    else {
      local_648 = ref_node_00->global[local[6]];
    }
    local_650 = (REF_INT)(local_648 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[6] < 0) || (ref_node_00->max <= local[6])) || (ref_node_00->global[local[6]] < 0)) {
      local_660 = -1;
    }
    else {
      local_660 = ref_node_00->global[local[6]];
    }
    local_650 = (int)((local_660 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[6]] = local_650;
  uVar2 = ref_node_add(ref_node_00,9,local + 7);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x10c
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add node");
    return uVar2;
  }
  ref_node_00->real[local[7] * 0xf] = 0.0;
  ref_node_00->real[local[7] * 0xf + 1] = 0.5;
  ref_node_00->real[local[7] * 0xf + 2] = 0.5;
  if (((local[7] < 0) || (ref_node_00->max <= local[7])) || (ref_node_00->global[local[7]] < 0)) {
    local_690 = -1;
  }
  else {
    local_690 = ref_node_00->global[local[7]];
  }
  if (local_690 / (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(ref_private_macro_code_rss -
            ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n))) {
    if (((local[7] < 0) || (ref_node_00->max <= local[7])) || (ref_node_00->global[local[7]] < 0)) {
      local_6b0 = -1;
    }
    else {
      local_6b0 = ref_node_00->global[local[7]];
    }
    local_6b8 = (REF_INT)(local_6b0 /
                         (long)((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[7] < 0) || (ref_node_00->max <= local[7])) || (ref_node_00->global[local[7]] < 0)) {
      local_6c8 = -1;
    }
    else {
      local_6c8 = ref_node_00->global[local[7]];
    }
    local_6b8 = (int)((local_6c8 -
                      (ref_private_macro_code_rss -
                      ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n)) *
                      ((ref_private_macro_code_rss + ref_mpi->n + -1) / ref_mpi->n)) /
                     (long)((ref_private_macro_code_rss + -1) / ref_mpi->n)) +
                (ref_private_macro_code_rss -
                ref_mpi->n * ((ref_private_macro_code_rss + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[7]] = local_6b8;
  uVar2 = ref_cell_add(pRVar1->cell[0xc],&cell,&ref_private_macro_code_rss_1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x10e
           ,"ref_fixture_te2_grid",(ulong)uVar2,"add tet");
    return uVar2;
  }
LAB_00151cae:
  ref_grid_ptr_local._4_4_ =
       ref_node_initialize_n_global(ref_node_00,(long)ref_private_macro_code_rss);
  if (ref_grid_ptr_local._4_4_ == 0) {
    ref_grid_ptr_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x111
           ,"ref_fixture_te2_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_te2_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 10;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  global[6] = 6;
  global[7] = 7;
  global[8] = 8;
  global[9] = 9;

  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[6]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[7]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[8]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[9])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 0.5, 0.0, 0.0);
    add_that_node(5, 0.5, 0.5, 0.0);
    add_that_node(6, 0.0, 0.5, 0.0);
    add_that_node(7, 0.0, 0.0, 0.5);
    add_that_node(8, 0.5, 0.0, 0.5);
    add_that_node(9, 0.0, 0.5, 0.5);

    RSS(ref_cell_add(ref_grid_te2(ref_grid), local, &cell), "add tet");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}